

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsmcpl.c
# Opt level: O3

int mcpl2phits_parse_args
              (int argc,char **argv,char **inmcplfile,char **outphitsfile,uint64_t *nparticles_limit
              ,int *use64bitreclen,int *nopolarisation)

{
  uint64_t uVar1;
  int iVar2;
  size_t sVar3;
  char **ppcVar4;
  long lVar5;
  char cVar6;
  uint64_t *puVar7;
  int *piVar8;
  char *pcVar9;
  ulong uVar10;
  uint64_t local_50;
  uint64_t *local_48;
  int *local_40;
  ulong local_38;
  
  *inmcplfile = (char *)0x0;
  *outphitsfile = (char *)0x0;
  *nparticles_limit = 0xffffffffffffffff;
  *use64bitreclen = 0;
  *nopolarisation = 0;
  local_50 = 0xffffffffffffffff;
  local_48 = nparticles_limit;
  local_40 = use64bitreclen;
  if (1 < argc) {
    local_38 = (ulong)(uint)argc;
    uVar10 = 1;
    do {
      pcVar9 = argv[uVar10];
      sVar3 = strlen(pcVar9);
      if (sVar3 != 0) {
        if (sVar3 == 1) {
          cVar6 = *pcVar9;
        }
        else {
          cVar6 = *pcVar9;
          if ((cVar6 == '-') && (pcVar9[1] != '-')) {
            lVar5 = 0;
            puVar7 = (uint64_t *)0x0;
            do {
              if (puVar7 == (uint64_t *)0x0) {
                switch(pcVar9[lVar5 + 1]) {
                case 'f':
                  piVar8 = local_40;
                  break;
                default:
                  pcVar9 = "Unrecognised option";
                  goto LAB_00103749;
                case 'h':
                  goto switchD_00103669_caseD_68;
                case 'l':
                  local_50 = 0;
                  puVar7 = &local_50;
                  if (sVar3 - 2 != lVar5) goto LAB_00103697;
                  pcVar9 = "Bad option: missing number";
                  goto LAB_00103749;
                case 'n':
                  piVar8 = nopolarisation;
                }
                *piVar8 = 1;
                puVar7 = (uint64_t *)0x0;
              }
              else {
                if ((byte)(pcVar9[lVar5 + 1] - 0x3aU) < 0xf6) {
                  pcVar9 = "Bad option: expected number";
                  goto LAB_00103749;
                }
                uVar1 = *puVar7;
                *puVar7 = uVar1 * 10;
                *puVar7 = (uVar1 * 10 + (long)pcVar9[lVar5 + 1]) - 0x30;
              }
LAB_00103697:
              lVar5 = lVar5 + 1;
            } while (sVar3 - 1 != lVar5);
            goto LAB_001035fe;
          }
          if ((sVar3 == 6) && (iVar2 = strcmp(pcVar9,"--help"), iVar2 == 0)) {
switchD_00103669_caseD_68:
            mcpl2phits_app_usage(argv,(char *)0x0);
            return -1;
          }
        }
        if (cVar6 == '-') {
          pcVar9 = "Bad arguments";
          goto LAB_00103749;
        }
        if (*outphitsfile != (char *)0x0) {
          pcVar9 = "Too many arguments.";
          goto LAB_00103749;
        }
        ppcVar4 = outphitsfile;
        if (*inmcplfile == (char *)0x0) {
          ppcVar4 = inmcplfile;
        }
        *ppcVar4 = pcVar9;
      }
LAB_001035fe:
      uVar10 = uVar10 + 1;
    } while (uVar10 != local_38);
  }
  if (*inmcplfile == (char *)0x0) {
    pcVar9 = "Missing argument : input MCPL file";
LAB_00103749:
    printf("ERROR: %s\n\n",pcVar9);
    puts("Run with -h or --help for usage information");
    iVar2 = 1;
  }
  else {
    if (*outphitsfile == (char *)0x0) {
      *outphitsfile = "phits.dmp";
    }
    iVar2 = 0;
    if ((long)local_50 < 1) {
      local_50 = 0;
    }
    *local_48 = local_50;
  }
  return iVar2;
}

Assistant:

int mcpl2phits_parse_args( int argc,const char **argv, const char** inmcplfile,
                           const char **outphitsfile, uint64_t* nparticles_limit,
                           int* use64bitreclen, int* nopolarisation ) {
  //returns: 0 all ok, 1: error, -1: all ok but do nothing (-h/--help mode)
  *inmcplfile = 0;
  *outphitsfile = 0;
  *nparticles_limit = UINT64_MAX;
  *use64bitreclen = 0;
  *nopolarisation = 0;

  int64_t opt_num_limit = -1;
  int i;
  for (i = 1; i<argc; ++i) {
    const char * a = argv[i];
    size_t n = strlen(a);
    if (!n)
      continue;
    if (n>=2&&a[0]=='-'&&a[1]!='-') {
      //short options:
      int64_t * consume_digit = 0;
      size_t j;
      for (j=1; j<n; ++j) {
        if (consume_digit) {
          if (a[j]<'0'||a[j]>'9')
            return mcpl2phits_app_usage(argv,"Bad option: expected number");
          *consume_digit *= 10;
          *consume_digit += a[j] - '0';
          continue;
        }
        switch(a[j]) {
        case 'h': mcpl2phits_app_usage(argv,0); return -1;
        case 'l': consume_digit = &opt_num_limit; break;
        case 'f': *use64bitreclen = 1; break;
        case 'n': *nopolarisation = 1; break;
        default:
          return mcpl2phits_app_usage(argv,"Unrecognised option");
        }
        if (consume_digit) {
          *consume_digit = 0;
          if (j+1==n)
            return mcpl2phits_app_usage(argv,"Bad option: missing number");
        }
      }

    } else if (n==6 && strcmp(a,"--help")==0) {
      mcpl2phits_app_usage(argv,0);
      return -1;
    } else if (n>=1&&a[0]!='-') {
      if (*outphitsfile)
        return mcpl2phits_app_usage(argv,"Too many arguments.");
      else if (*inmcplfile) *outphitsfile = a;
      else *inmcplfile = a;
    } else {
      return mcpl2phits_app_usage(argv,"Bad arguments");
    }
  }

  if (!*inmcplfile)
    return mcpl2phits_app_usage(argv,"Missing argument : input MCPL file");
  if (!*outphitsfile)
    *outphitsfile = "phits.dmp";

  if (opt_num_limit<=0)
    opt_num_limit = 0;

  //NB: For now we allow unlimited number of particles in the file - but let the
  //mcpl2phits method emit a WARNING if exceeding INT32_MAX particles.
  *nparticles_limit = opt_num_limit;

  return 0;
}